

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueMigrateMemINTEL
                 (cl_command_queue queue,void *ptr,size_t size,cl_mem_migration_flags flags,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  char *enqueueCounter_00;
  CLIntercept *this;
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  SConfig *pSVar6;
  undefined8 uVar7;
  SConfig *pSVar8;
  cl_icd_dispatch *pcVar9;
  CLIntercept *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  void *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cl_uint in_R8D;
  cl_event *in_R9;
  cl_event *in_stack_00000008;
  CLIntercept *in_stack_00000098;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  cl_event *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  cl_command_queue in_stack_fffffffffffffb18;
  CLIntercept *in_stack_fffffffffffffb20;
  CObjectTracker *in_stack_fffffffffffffb28;
  uint64_t in_stack_fffffffffffffb30;
  CLIntercept *in_stack_fffffffffffffb38;
  allocator *paVar11;
  CLIntercept *in_stack_fffffffffffffb40;
  allocator *in_stack_fffffffffffffb68;
  CLIntercept *in_stack_fffffffffffffb70;
  CLIntercept *in_stack_fffffffffffffb78;
  cl_event *in_stack_fffffffffffffb80;
  cl_event *in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  cl_uint numEvents;
  cl_event p_Var12;
  char *in_stack_fffffffffffffb98;
  CLIntercept *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  SConfig *in_stack_fffffffffffffbb0;
  cl_event in_stack_fffffffffffffbb8;
  CLIntercept *in_stack_fffffffffffffbc0;
  time_point in_stack_fffffffffffffbc8;
  time_point in_stack_fffffffffffffbd0;
  time_point in_stack_fffffffffffffbd8;
  time_point in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffc10;
  allocator *in_stack_fffffffffffffc18;
  undefined6 in_stack_fffffffffffffc20;
  byte in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  allocator *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  SConfig *in_stack_fffffffffffffc38;
  undefined6 in_stack_fffffffffffffc40;
  undefined1 uVar13;
  CLIntercept *in_stack_fffffffffffffc48;
  time_point in_stack_fffffffffffffc50;
  cl_int in_stack_fffffffffffffd24;
  char *in_stack_fffffffffffffd28;
  cl_int errorCode;
  CLIntercept *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  CLIntercept *in_stack_fffffffffffffd40;
  allocator local_289;
  string local_288 [32];
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  allocator local_231;
  string local_230 [16];
  string local_1f8 [32];
  undefined8 local_1d8;
  cl_int local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  size_t *local_1a8;
  undefined1 local_199 [40];
  allocator local_171;
  string local_170 [45];
  byte local_143;
  byte local_142;
  allocator local_141;
  string local_140 [40];
  size_t *local_118;
  allocator local_109;
  size_t *in_stack_fffffffffffffef8;
  cl_uint in_stack_ffffffffffffff04;
  cl_kernel in_stack_ffffffffffffff08;
  uint64_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  CLIntercept *in_stack_ffffffffffffff20;
  undefined8 local_d8;
  size_t *in_stack_ffffffffffffff30;
  cl_command_queue in_stack_ffffffffffffff38;
  cl_event local_b8 [2];
  string local_a8 [48];
  string local_78 [32];
  char *local_58;
  cl_int local_4c;
  CLdispatchX *local_48;
  CLIntercept *local_40;
  cl_event *local_38;
  cl_uint local_2c;
  CLIntercept *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  void *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  cl_int local_4;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffba8 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = GetIntercept();
  if ((local_40 == (CLIntercept *)0x0) ||
     (local_48 = CLIntercept::dispatchX(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18),
     local_48->clEnqueueMigrateMemINTEL ==
     (_func_cl_int_cl_command_queue_void_ptr_size_t_cl_mem_migration_flags_cl_uint_cl_event_ptr_cl_event_ptr
      *)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffd24)
    ;
    local_4 = -0x24;
  }
  else {
    local_4c = 0;
    local_58 = (char *)CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffb78);
    pSVar6 = CLIntercept::config(local_40);
    if (((pSVar6->AubCapture & 1U) != 0) &&
       ((bVar3 = CLIntercept::checkAubCaptureEnqueueLimits(local_40,(uint64_t)local_58), bVar3 &&
        (pSVar6 = CLIntercept::config(local_40), (pSVar6->AubCaptureIndividualEnqueues & 1U) == 0)))
       ) {
      in_stack_fffffffffffffb10 = local_10;
      CLIntercept::startAubCapture
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    }
    pSVar6 = CLIntercept::config(local_40);
    if ((pSVar6->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffffb38,(cl_uint)(in_stack_fffffffffffffb30 >> 0x20),
                 (cl_event *)in_stack_fffffffffffffb28);
      pSVar6 = CLIntercept::config(local_40);
      pbVar2 = local_10;
      pvVar1 = local_18;
      pbVar10 = local_20;
      this = local_40;
      enqueueCounter_00 = local_58;
      if ((pSVar6->CallLogging & 1U) != 0) {
        CLIntercept::enumName(local_40);
        CEnumNameMap::name_mem_migration_flags_abi_cxx11_
                  ((CEnumNameMap *)in_stack_fffffffffffffb78,
                   (cl_mem_migration_flags)in_stack_fffffffffffffb70);
        uVar7 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffb20 = local_28;
        in_stack_fffffffffffffb28 = (CObjectTracker *)std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueMigrateMemINTEL",(uint64_t)enqueueCounter_00,(cl_kernel)0x0,
                   "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",pbVar2,pvVar1,pbVar10,
                   uVar7);
        std::__cxx11::string::~string(local_a8);
        in_stack_fffffffffffffb10 = pbVar10;
      }
      pSVar6 = CLIntercept::config(local_40);
      if ((pSVar6->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,numEvents,
                   in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      local_b8[0] = (cl_event)0x0;
      bVar3 = false;
      pSVar6 = CLIntercept::config(local_40);
      if (((((pSVar6->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar6 = CLIntercept::config(local_40), (pSVar6->ITTPerformanceTiming & 1U) != 0)) ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromePerformanceTiming & 1U) != 0)) ||
         (pSVar6 = CLIntercept::config(local_40),
         (pSVar6->DevicePerfCounterEventBasedSampling & 1U) != 0)) {
        local_b8[1] = (cl_event)std::chrono::_V2::steady_clock::now();
        bVar3 = in_stack_00000008 == (cl_event *)0x0;
        if (bVar3) {
          in_stack_00000008 = local_b8;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      pSVar6 = CLIntercept::config(local_40);
      if (((pSVar6->HostPerformanceTiming & 1U) != 0) ||
         (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0)) {
        in_stack_ffffffffffffff30 = (size_t *)std::chrono::_V2::steady_clock::now();
      }
      __rhs = in_stack_00000008;
      local_4c = (*local_48->clEnqueueMigrateMemINTEL)
                           ((cl_command_queue)local_10,local_18,(size_t)local_20,
                            (cl_mem_migration_flags)local_28,local_2c,local_38,in_stack_00000008);
      pSVar6 = CLIntercept::config(local_40);
      if (((pSVar6->HostPerformanceTiming & 1U) != 0) ||
         (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0)) {
        local_d8 = std::chrono::_V2::steady_clock::now();
        pSVar6 = CLIntercept::config(local_40);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar4 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_40,(uint64_t)local_58), bVar4)) {
          std::allocator<char>::allocator();
          local_118 = in_stack_ffffffffffffff30;
          std::__cxx11::string::string((string *)&stack0xfffffffffffffef8,"",&local_109);
          local_140._32_8_ = local_d8;
          in_stack_ffffffffffffff30 = local_118;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r,
                     (char *)in_stack_fffffffffffffbc8.__d.__r,(string *)in_stack_fffffffffffffbc0,
                     in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
        }
      }
      pSVar6 = CLIntercept::config(local_40);
      if ((((((pSVar6->DevicePerformanceTiming & 1U) != 0) ||
            (pSVar8 = CLIntercept::config(local_40), (pSVar8->ITTPerformanceTiming & 1U) != 0)) ||
           (in_stack_fffffffffffffc50.__d.__r = (duration)CLIntercept::config(local_40),
           (((SConfig *)in_stack_fffffffffffffc50.__d.__r)->ChromePerformanceTiming & 1U) != 0)) ||
          (in_stack_fffffffffffffc48 = (CLIntercept *)CLIntercept::config(local_40),
          ((ulong)(in_stack_fffffffffffffc48->m_Dispatch).clSetCommandQueueProperty & 1) != 0)) &&
         (in_stack_00000008 != (cl_event *)0x0)) {
        local_142 = 0;
        local_143 = 0;
        uVar5 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_40,(uint64_t)local_58);
        in_stack_fffffffffffffc26 = false;
        if ((bool)uVar5) {
          in_stack_fffffffffffffc38 = CLIntercept::config(local_40);
          in_stack_fffffffffffffc37 = true;
          in_stack_fffffffffffffc26 = true;
          if ((in_stack_fffffffffffffc38->DevicePerformanceTimingSkipUnmap & 1U) != 0) {
            in_stack_fffffffffffffc28 = &local_141;
            std::allocator<char>::allocator();
            local_142 = 1;
            std::__cxx11::string::string
                      (local_140,"clEnqueueMigrateMemINTEL",in_stack_fffffffffffffc28);
            local_143 = 1;
            in_stack_fffffffffffffc27 = std::operator!=(in_stack_fffffffffffffb10,(char *)__rhs);
            in_stack_fffffffffffffc37 = in_stack_fffffffffffffc27;
            in_stack_fffffffffffffc26 = in_stack_fffffffffffffc27;
          }
        }
        uVar13 = in_stack_fffffffffffffc26;
        if ((local_143 & 1) != 0) {
          std::__cxx11::string::~string(local_140);
        }
        if ((local_142 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
        }
        if ((in_stack_fffffffffffffc26 & 1) != 0) {
          local_170._32_8_ = local_b8[1];
          in_stack_fffffffffffffc18 = &local_171;
          in_stack_fffffffffffffc10 = local_58;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,"",in_stack_fffffffffffffc18);
          CLIntercept::addTimingEvent
                    (in_stack_fffffffffffffc48,
                     (char *)CONCAT17(uVar5,CONCAT16(uVar13,in_stack_fffffffffffffc40)),
                     (uint64_t)in_stack_fffffffffffffc38,in_stack_fffffffffffffc50,
                     (string *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                     (cl_command_queue)in_stack_fffffffffffffc28,(cl_event)pSVar6);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
        }
        if (bVar3) {
          pcVar9 = CLIntercept::dispatch(local_40);
          (*pcVar9->clReleaseEvent)(*in_stack_00000008);
          in_stack_00000008 = (cl_event *)0x0;
        }
      }
      pSVar6 = CLIntercept::config(local_40);
      if (((((pSVar6->ErrorLogging & 1U) != 0) ||
           (pSVar6 = CLIntercept::config(local_40), (pSVar6->ErrorAssert & 1U) != 0)) ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->NoErrors & 1U) != 0)) && (local_4c != 0)
         ) {
        in_stack_fffffffffffffbe0.__d.__r = (duration)CLIntercept::config(local_40);
        if ((((SConfig *)in_stack_fffffffffffffbe0.__d.__r)->ErrorLogging & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
        }
        in_stack_fffffffffffffbd8.__d.__r = (duration)CLIntercept::config(local_40);
        if ((((SConfig *)in_stack_fffffffffffffbd8.__d.__r)->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        in_stack_fffffffffffffbd0.__d.__r = (duration)CLIntercept::config(local_40);
        if (((ulong)(((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r)->m_Dispatch).
                    clCreateSubDevices & 0x100000000) != 0) {
          local_4c = 0;
        }
      }
      in_stack_fffffffffffffbc8.__d.__r = (duration)CLIntercept::config(local_40);
      if ((((SConfig *)in_stack_fffffffffffffbc8.__d.__r)->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffbc0 = (CLIntercept *)CLIntercept::objectTracker(local_40);
        if (in_stack_00000008 == (cl_event *)0x0) {
          in_stack_fffffffffffffbb8 = (cl_event)0x0;
        }
        else {
          in_stack_fffffffffffffbb8 = *in_stack_00000008;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffb28,(_cl_event *)in_stack_fffffffffffffb20);
      }
      in_stack_fffffffffffffbb0 = CLIntercept::config(local_40);
      if ((in_stack_fffffffffffffbb0->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,numEvents,
                   in_stack_fffffffffffffb88,(cl_sync_point_khr *)in_stack_fffffffffffffb80);
      }
      pSVar6 = CLIntercept::config(local_40);
      if ((pSVar6->ChromeCallLogging & 1U) != 0) {
        in_stack_fffffffffffffba0 = (CLIntercept *)local_199;
        std::allocator<char>::allocator();
        local_1a8 = in_stack_ffffffffffffff30;
        std::__cxx11::string::string
                  ((string *)(local_199 + 1),"",(allocator *)in_stack_fffffffffffffba0);
        local_1b0 = local_d8;
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
                   (string *)in_stack_fffffffffffffbb0,SUB81((ulong)pSVar6 >> 0x38,0),
                   (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8);
        std::__cxx11::string::~string((string *)(local_199 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_199);
      }
      uVar5 = (undefined1)((ulong)pSVar6 >> 0x38);
      if (in_stack_00000008 == (cl_event *)0x0) {
        p_Var12 = (cl_event)0x0;
      }
      else {
        p_Var12 = *in_stack_00000008;
      }
      if ((p_Var12 != (cl_event)0x0) &&
         ((pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromePerformanceTiming & 1U) != 0)))) {
        if (in_stack_00000008 == (cl_event *)0x0) {
          in_stack_fffffffffffffb70 = (CLIntercept *)0x0;
        }
        else {
          in_stack_fffffffffffffb70 = (CLIntercept *)*in_stack_00000008;
        }
        CLIntercept::addEvent
                  (in_stack_fffffffffffffb40,(cl_event)in_stack_fffffffffffffb38,
                   in_stack_fffffffffffffb30);
      }
      std::__cxx11::string::~string(local_78);
    }
    errorCode = (cl_int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    pSVar6 = CLIntercept::config(local_40);
    if ((pSVar6->FinishAfterEnqueue & 1U) == 0) {
      pSVar6 = CLIntercept::config(local_40);
      if ((pSVar6->FlushAfterEnqueue & 1U) != 0) {
        pcVar9 = CLIntercept::dispatch(local_40);
        (*pcVar9->clFlush)((cl_command_queue)local_10);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      pSVar6 = CLIntercept::config(local_40);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(local_40), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_1c8 = std::chrono::_V2::steady_clock::now();
        local_1b8 = local_1c8;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                ((CLIntercept *)
                 CONCAT17(in_stack_fffffffffffffc27,
                          CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                 (char *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      pcVar9 = CLIntercept::dispatch(local_40);
      local_1cc = (*pcVar9->clFinish)((cl_command_queue)local_10);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (char *)in_stack_fffffffffffffd30,errorCode);
      pSVar6 = CLIntercept::config(local_40);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(local_40), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_1d8 = std::chrono::_V2::steady_clock::now();
        local_1c0 = local_1d8;
        pSVar6 = CLIntercept::config(local_40);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_40,(uint64_t)local_58), bVar3)) {
          in_stack_fffffffffffffb68 = (allocator *)&stack0xfffffffffffffe07;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f8,"",in_stack_fffffffffffffb68);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r,
                     (char *)in_stack_fffffffffffffbc8.__d.__r,(string *)in_stack_fffffffffffffbc0,
                     in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string(local_1f8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
        }
        pSVar6 = CLIntercept::config(local_40);
        if ((pSVar6->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_230,"",&local_231);
          local_240 = local_1b8;
          local_248 = local_1c0;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
                     (string *)in_stack_fffffffffffffbb0,(bool)uVar5,
                     (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
          std::__cxx11::string::~string(local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb10);
      pSVar6 = CLIntercept::config(local_40);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(local_40), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_260 = std::chrono::_V2::steady_clock::now();
        local_250 = local_260;
      }
      CLIntercept::checkTimingEvents(in_stack_00000098);
      pSVar6 = CLIntercept::config(local_40);
      if (((pSVar6->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar6 = CLIntercept::config(local_40), (pSVar6->HostPerformanceTiming & 1U) != 0 ||
          (pSVar6 = CLIntercept::config(local_40), (pSVar6->ChromeCallLogging & 1U) != 0)))) {
        local_268 = std::chrono::_V2::steady_clock::now();
        local_258 = local_268;
        pSVar6 = CLIntercept::config(local_40);
        if (((pSVar6->HostPerformanceTiming & 1U) != 0) &&
           (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_40,(uint64_t)local_58), bVar3)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"",&local_289);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffbd0.__d.__r,
                     (char *)in_stack_fffffffffffffbc8.__d.__r,(string *)in_stack_fffffffffffffbc0,
                     in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
        }
        pSVar6 = CLIntercept::config(local_40);
        if ((pSVar6->ChromeCallLogging & 1U) != 0) {
          paVar11 = (allocator *)&stack0xfffffffffffffd3f;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffd40,"",paVar11);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
                     (string *)in_stack_fffffffffffffbb0,(bool)uVar5,
                     (uint64_t)in_stack_fffffffffffffba0,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd3f);
        }
      }
    }
    pSVar6 = CLIntercept::config(local_40);
    if (((pSVar6->AubCapture & 1U) != 0) &&
       ((pSVar6 = CLIntercept::config(local_40), (pSVar6->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar3 = CLIntercept::checkAubCaptureEnqueueLimits(local_40,(uint64_t)local_58), !bVar3))))
    {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffb70,(cl_command_queue)in_stack_fffffffffffffb68);
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueMigrateMemINTEL(
    cl_command_queue queue,
    const void* ptr,
    size_t size,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clEnqueueMigrateMemINTEL )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                const std::string eventWaitListString = getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);

                CALL_LOGGING_ENTER( "queue = %p, ptr = %p, size = %zu, flags = %s (%llX)%s",
                    queue,
                    ptr,
                    size,
                    pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                    flags,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueMigrateMemINTEL(
                    queue,
                    ptr,
                    size,
                    flags,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( queue );
            CHECK_AUBCAPTURE_STOP( queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}